

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::TestResult::ValidateTestProperty(TestProperty *test_property)

{
  bool bVar1;
  char *a_c_str;
  Message *pMVar2;
  String *in_stack_ffffffffffffff80;
  Message *in_stack_ffffffffffffff90;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  String key;
  TestProperty *test_property_local;
  
  key.length_ = (size_t)test_property;
  a_c_str = TestProperty::key(test_property);
  internal::String::String((String *)local_28,a_c_str);
  bVar1 = internal::String::operator==((String *)local_28,"name");
  if (!bVar1) {
    bVar1 = internal::String::operator==((String *)local_28,"status");
    if (!bVar1) {
      bVar1 = internal::String::operator==((String *)local_28,"time");
      if (!bVar1) {
        bVar1 = internal::String::operator==((String *)local_28,"classname");
        if (!bVar1) {
          test_property_local._7_1_ = true;
          goto LAB_001225e1;
        }
      }
    }
  }
  Message::Message(in_stack_ffffffffffffff90);
  pMVar2 = Message::operator<<(local_40,(char (*) [40])"Reserved key used in RecordProperty(): ");
  pMVar2 = Message::operator<<(pMVar2,(String *)local_28);
  pMVar2 = Message::operator<<(pMVar2,(char (*) [61])
                                      " (\'name\', \'status\', \'time\', and \'classname\' are reserved by "
                              );
  in_stack_ffffffffffffff80 = (String *)Message::operator<<(pMVar2,(char (*) [12])"Google Test");
  pMVar2 = Message::operator<<((Message *)in_stack_ffffffffffffff80,(char (*) [2])0x14f40b);
  internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest.cc"
             ,0x72a,"Failed");
  internal::AssertHelper::operator=(&local_48,pMVar2);
  internal::AssertHelper::~AssertHelper(&local_48);
  Message::~Message((Message *)0x12258d);
  test_property_local._7_1_ = false;
LAB_001225e1:
  internal::String::~String(in_stack_ffffffffffffff80);
  return test_property_local._7_1_;
}

Assistant:

bool TestResult::ValidateTestProperty(const TestProperty& test_property) {
  internal::String key(test_property.key());
  if (key == "name" || key == "status" || key == "time" || key == "classname") {
    ADD_FAILURE()
        << "Reserved key used in RecordProperty(): "
        << key
        << " ('name', 'status', 'time', and 'classname' are reserved by "
        << GTEST_NAME_ << ")";
    return false;
  }
  return true;
}